

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

void __thiscall lwlog::details::pattern::request_flag_formatters(pattern *this)

{
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar1;
  bool bVar2;
  reference pbVar3;
  pointer pvVar4;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
  local_d8;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
  local_d0;
  const_iterator it_1;
  basic_string_view<char,_std::char_traits<char>_> flag_1;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_b0;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2_1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
  local_90;
  const_iterator it;
  basic_string_view<char,_std::char_traits<char>_> flag;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_50;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_38;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *short_flags;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_18;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *verbose_flags;
  pattern *this_local;
  
  verbose_flags =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        *)this;
  parse_verbose_flags((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)&short_flags,this);
  local_18 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&short_flags;
  parse_short_flags(&local_50,this);
  pvVar1 = local_18;
  local_38 = &local_50;
  __end2 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(local_18);
  flag._M_str = (char *)std::
                        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ::end(pvVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                     *)&flag._M_str), pvVar1 = local_38, bVar2) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end2);
    it.
    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
               )pbVar3->_M_len;
    flag._M_len = (size_t)pbVar3->_M_str;
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
         ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
                 *)verbose_data,(key_type *)&it);
    __range2_1 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)std::
                    unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
                    ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
                           *)verbose_data);
    bVar2 = std::__detail::operator!=
                      (&local_90,
                       (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
                        *)&__range2_1);
    if (bVar2) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_false,_true>
                             *)&local_90);
      std::
      vector<std::shared_ptr<lwlog::details::formatter>,_std::allocator<std::shared_ptr<lwlog::details::formatter>_>_>
      ::push_back(&this->m_formatters,&pvVar4->second);
    }
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin(local_38);
  local_b0._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::end(pvVar1);
  while (bVar2 = __gnu_cxx::operator!=(&__end2_1,&local_b0), bVar2) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end2_1);
    it_1.
    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
               )pbVar3->_M_len;
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
         ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
                 *)shortened_data,(key_type *)&it_1);
    local_d8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
         ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>_>
                *)shortened_data);
    bVar2 = std::__detail::operator!=(&local_d0,&local_d8);
    if (bVar2) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_false,_true>
                             *)&local_d0);
      std::
      vector<std::shared_ptr<lwlog::details::formatter>,_std::allocator<std::shared_ptr<lwlog::details::formatter>_>_>
      ::push_back(&this->m_formatters,&pvVar4->second);
    }
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_50);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)&short_flags);
  return;
}

Assistant:

void pattern::request_flag_formatters()
	{
		const auto& verbose_flags{ this->parse_verbose_flags() };
		const auto& short_flags{ this->parse_short_flags() };

		for (const auto flag : verbose_flags)
		{
			if (const auto it{ verbose_data.find(flag) }; 
				it != verbose_data.end())
			{
				m_formatters.push_back(it->second);
			}
		}

		for (const auto flag : short_flags)
		{
			if (const auto it{ shortened_data.find(flag) }; 
				it != shortened_data.end())
			{
				m_formatters.push_back(it->second);
			}
		}
	}